

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::draw_buffers(NegativeTestContext *ctx)

{
  allocator<unsigned_int> *this;
  NegativeTestContext *pNVar1;
  int iVar2;
  value_type vVar3;
  reference pvVar4;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<float> local_89;
  undefined1 local_88 [8];
  vector<float,_std::allocator<float>_> data;
  undefined1 local_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  allocator<unsigned_int> local_39;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  int maxColorAttachments;
  int maxDrawBuffers;
  deUint32 texture;
  deUint32 fbo;
  NegativeTestContext *ctx_local;
  
  maxDrawBuffers = 0x1234;
  maxColorAttachments = 0x1234;
  values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1234;
  values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = -1;
  _texture = ctx;
  glu::CallLogWrapper::glGetIntegerv
            (&ctx->super_CallLogWrapper,0x8cdf,
             (GLint *)&values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glGetIntegerv
            (&_texture->super_CallLogWrapper,0x8824,
             (GLint *)((long)&values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  iVar2 = values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  std::allocator<unsigned_int>::allocator(&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(long)iVar2,&local_39);
  std::allocator<unsigned_int>::~allocator(&local_39);
  this = (allocator<unsigned_int> *)
         ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,4,this);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<float>::allocator(&local_89);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_88,0x400,&local_89);
  std::allocator<float>::~allocator(&local_89);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  *pvVar4 = 0;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,1);
  *pvVar4 = 0x405;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,2);
  *pvVar4 = 0x8ce0;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,3);
  *pvVar4 = 0x8d00;
  vVar3 = (int)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x8ce0;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,0);
  *pvVar4 = vVar3;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,1);
  *pvVar4 = 0x8ce0;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,2);
  *pvVar4 = 0x8ce1;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,3);
  *pvVar4 = 0;
  glu::CallLogWrapper::glGenTextures
            (&_texture->super_CallLogWrapper,1,(GLuint *)&maxColorAttachments);
  glu::CallLogWrapper::glBindTexture(&_texture->super_CallLogWrapper,0xde1,maxColorAttachments);
  glu::CallLogWrapper::glTexImage2D
            (&_texture->super_CallLogWrapper,0xde1,0,0x8058,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glGenFramebuffers
            (&_texture->super_CallLogWrapper,1,(GLuint *)&maxDrawBuffers);
  glu::CallLogWrapper::glBindFramebuffer(&_texture->super_CallLogWrapper,0x8d40,maxDrawBuffers);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_texture->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,maxColorAttachments,0);
  glu::CallLogWrapper::glCheckFramebufferStatus(&_texture->super_CallLogWrapper,0x8d40);
  NegativeTestContext::expectError(_texture,0);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "GL_INVALID_ENUM is generated if one of the values in bufs is not an accepted value.",
             &local_b1);
  NegativeTestContext::beginSection(pNVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  pNVar1 = _texture;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,2);
  glu::CallLogWrapper::glDrawBuffers(&pNVar1->super_CallLogWrapper,2,pvVar4);
  NegativeTestContext::expectError(_texture,0x500);
  NegativeTestContext::endSection(_texture);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "GL_INVALID_OPERATION is generated if the GL is bound to a draw framebuffer and DrawBuffers is supplied with BACK or COLOR_ATTACHMENTm where m is greater than or equal to the value of MAX_COLOR_ATTACHMENTS."
             ,&local_d9);
  NegativeTestContext::beginSection(pNVar1,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  glu::CallLogWrapper::glBindFramebuffer(&_texture->super_CallLogWrapper,0x8d40,maxDrawBuffers);
  pNVar1 = _texture;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,1);
  glu::CallLogWrapper::glDrawBuffers(&pNVar1->super_CallLogWrapper,1,pvVar4);
  NegativeTestContext::expectError(_texture,0x502);
  pNVar1 = _texture;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,0);
  glu::CallLogWrapper::glDrawBuffers(&pNVar1->super_CallLogWrapper,4,pvVar4);
  NegativeTestContext::expectError(_texture,0x502);
  NegativeTestContext::endSection(_texture);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,
             "GL_INVALID_OPERATION is generated if the GL is bound to the default framebuffer and n is not 1."
             ,&local_101);
  NegativeTestContext::beginSection(pNVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  glu::CallLogWrapper::glBindFramebuffer(&_texture->super_CallLogWrapper,0x8d40,0);
  pNVar1 = _texture;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  glu::CallLogWrapper::glDrawBuffers(&pNVar1->super_CallLogWrapper,2,pvVar4);
  NegativeTestContext::expectError(_texture,0x502);
  NegativeTestContext::endSection(_texture);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,
             "GL_INVALID_OPERATION is generated if the GL is bound to the default framebuffer and the value in bufs is one of the GL_COLOR_ATTACHMENTn tokens."
             ,&local_129);
  NegativeTestContext::beginSection(pNVar1,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  glu::CallLogWrapper::glBindFramebuffer(&_texture->super_CallLogWrapper,0x8d40,0);
  pNVar1 = _texture;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,2);
  glu::CallLogWrapper::glDrawBuffers(&pNVar1->super_CallLogWrapper,1,pvVar4);
  NegativeTestContext::expectError(_texture,0x502);
  NegativeTestContext::endSection(_texture);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,
             "GL_INVALID_OPERATION is generated if the GL is bound to a framebuffer object and the ith buffer listed in bufs is anything other than GL_NONE or GL_COLOR_ATTACHMENTSi."
             ,&local_151);
  NegativeTestContext::beginSection(pNVar1,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  glu::CallLogWrapper::glBindFramebuffer(&_texture->super_CallLogWrapper,0x8d40,maxDrawBuffers);
  pNVar1 = _texture;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,1);
  glu::CallLogWrapper::glDrawBuffers(&pNVar1->super_CallLogWrapper,1,pvVar4);
  NegativeTestContext::expectError(_texture,0x502);
  pNVar1 = _texture;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,0);
  glu::CallLogWrapper::glDrawBuffers(&pNVar1->super_CallLogWrapper,4,pvVar4);
  NegativeTestContext::expectError(_texture,0x502);
  NegativeTestContext::endSection(_texture);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,
             "GL_INVALID_VALUE is generated if n is less than 0 or greater than GL_MAX_DRAW_BUFFERS."
             ,&local_179);
  NegativeTestContext::beginSection(pNVar1,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  pNVar1 = _texture;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,1);
  glu::CallLogWrapper::glDrawBuffers(&pNVar1->super_CallLogWrapper,-1,pvVar4);
  NegativeTestContext::expectError(_texture,0x501);
  pNVar1 = _texture;
  iVar2 = values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  glu::CallLogWrapper::glDrawBuffers(&pNVar1->super_CallLogWrapper,iVar2,pvVar4);
  NegativeTestContext::expectError(_texture,0x501);
  NegativeTestContext::endSection(_texture);
  glu::CallLogWrapper::glDeleteTextures
            (&_texture->super_CallLogWrapper,1,(GLuint *)&maxColorAttachments);
  glu::CallLogWrapper::glDeleteFramebuffers
            (&_texture->super_CallLogWrapper,1,(GLuint *)&maxDrawBuffers);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return;
}

Assistant:

void draw_buffers (NegativeTestContext& ctx)
{
	deUint32				fbo						= 0x1234;
	deUint32				texture					= 0x1234;
	int						maxDrawBuffers			= 0x1234;
	int						maxColorAttachments		= -1;
	ctx.glGetIntegerv		(GL_MAX_COLOR_ATTACHMENTS, &maxColorAttachments);
	ctx.glGetIntegerv		(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	std::vector<deUint32>	values					(maxDrawBuffers+1);
	std::vector<deUint32>	attachments				(4);
	std::vector<GLfloat>	data					(32*32);
	values[0]				= GL_NONE;
	values[1]				= GL_BACK;
	values[2]				= GL_COLOR_ATTACHMENT0;
	values[3]				= GL_DEPTH_ATTACHMENT;
	attachments[0]			= (glw::GLenum) (GL_COLOR_ATTACHMENT0 + maxColorAttachments);
	attachments[1]			= GL_COLOR_ATTACHMENT0;
	attachments[2]			= GL_COLOR_ATTACHMENT1;
	attachments[3]			= GL_NONE;

	ctx.glGenTextures			(1, &texture);
	ctx.glBindTexture			(GL_TEXTURE_2D, texture);
	ctx.glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL);
	ctx.glGenFramebuffers		(1, &fbo);
	ctx.glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
	ctx.glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture, 0);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if one of the values in bufs is not an accepted value.");
	ctx.glDrawBuffers			(2, &values[2]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the GL is bound to a draw framebuffer and DrawBuffers is supplied with BACK or COLOR_ATTACHMENTm where m is greater than or equal to the value of MAX_COLOR_ATTACHMENTS.");
	ctx.glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
	ctx.glDrawBuffers			(1, &values[1]);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.glDrawBuffers			(4, &attachments[0]);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the GL is bound to the default framebuffer and n is not 1.");
	ctx.glBindFramebuffer		(GL_FRAMEBUFFER, 0);
	ctx.glDrawBuffers			(2, &values[0]);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the GL is bound to the default framebuffer and the value in bufs is one of the GL_COLOR_ATTACHMENTn tokens.");
	ctx.glBindFramebuffer		(GL_FRAMEBUFFER, 0);
	ctx.glDrawBuffers			(1, &values[2]);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the GL is bound to a framebuffer object and the ith buffer listed in bufs is anything other than GL_NONE or GL_COLOR_ATTACHMENTSi.");
	ctx.glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
	ctx.glDrawBuffers			(1, &values[1]);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.glDrawBuffers			(4, &attachments[0]);
	ctx.expectError				(GL_INVALID_OPERATION);

	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if n is less than 0 or greater than GL_MAX_DRAW_BUFFERS.");
	ctx.glDrawBuffers			(-1, &values[1]);
	ctx.expectError				(GL_INVALID_VALUE);
	ctx.glDrawBuffers			(maxDrawBuffers+1, &values[0]);
	ctx.expectError				(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
	ctx.glDeleteFramebuffers(1, &fbo);
}